

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_17(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> vars;
  undefined1 local_ac [28];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  LNodeEStmt local_88;
  shared_ptr<LNode> expr;
  __shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<LNode> var;
  shared_ptr<LNodeData<LNodeEStmt>_> estmt;
  
  get_node((LParser *)&var,in_ESI);
  get_node((LParser *)&vars,in_ESI);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,(__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&vars);
  std::static_pointer_cast<LNodeData<LNodeChildren>,LNode>(&local_88.vars);
  std::vector<std::shared_ptr<LNode>,std::allocator<std::shared_ptr<LNode>>>::
  emplace_back<std::shared_ptr<LNode>>
            ((vector<std::shared_ptr<LNode>,std::allocator<std::shared_ptr<LNode>>> *)
             (local_88.vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),&var);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  get_node((LParser *)&expr,in_ESI);
  local_ac._0_4_ = 0x27;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_ac + 0x14),
             &vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_ac + 4),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&expr);
  LNodeEStmt::LNodeEStmt
            (&local_88,(shared_ptr<LNode> *)(local_ac + 0x14),(shared_ptr<LNode> *)(local_ac + 4));
  std::make_shared<LNodeData<LNodeEStmt>,LNodeType,LNodeEStmt>
            ((LNodeType *)&estmt,(LNodeEStmt *)local_ac);
  LNodeEStmt::~LNodeEStmt(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ac + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  _Var1 = estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_17() {
    // EStmt : Var Vars EQUAL Expr BR Brs
    auto var = this->get_node(6);
    auto vars = this->get_node(5);
    lnode_get<LNodeChildren>(vars)->value.push_front(std::move(var));
    auto expr = this->get_node(3);
    auto estmt = std::make_shared<LNodeData<LNodeEStmt>>(LNodeType::EStmt, LNodeEStmt(vars, expr));
    return estmt;
}